

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  string field_name;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_a0,"[",(allocator *)&local_80);
  bVar1 = TryConsume(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (bVar1) {
    bVar1 = ConsumeFullTypeName(this,&local_60);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_a0,"]",(allocator *)&local_80);
      bVar1 = Consume(this,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      if (bVar1) goto LAB_0060887e;
    }
  }
  else {
    bVar1 = ConsumeIdentifier(this,&local_60);
    if (bVar1) {
LAB_0060887e:
      std::__cxx11::string::string((string *)&local_a0,":",&local_a3);
      bVar1 = TryConsume(this,&local_a0);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_80,"{",&local_a1);
        __lhs = &(this->tokenizer_).current_.text;
        _Var2 = std::operator==(__lhs,&local_80);
        if (_Var2) {
          std::__cxx11::string::~string((string *)&local_80);
          goto LAB_006088de;
        }
        std::__cxx11::string::string((string *)&local_40,"<",&local_a2);
        _Var2 = std::operator==(__lhs,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        if (_Var2) goto LAB_006088e8;
        bVar1 = SkipFieldValue(this);
      }
      else {
LAB_006088de:
        std::__cxx11::string::~string((string *)&local_a0);
LAB_006088e8:
        bVar1 = SkipFieldMessage(this);
      }
      if (bVar1 != false) {
        std::__cxx11::string::string((string *)&local_a0,";",(allocator *)&local_40);
        bVar1 = TryConsume(this,&local_a0);
        if (!bVar1) {
          std::__cxx11::string::string((string *)&local_80,",",&local_a3);
          TryConsume(this,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
        }
        std::__cxx11::string::~string((string *)&local_a0);
        bVar1 = true;
        goto LAB_00608958;
      }
    }
  }
  bVar1 = false;
LAB_00608958:
  std::__cxx11::string::~string((string *)&local_60);
  return bVar1;
}

Assistant:

bool SkipField() {
    string field_name;
    if (TryConsume("[")) {
      // Extension name.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));
    } else {
      DO(ConsumeIdentifier(&field_name));
    }

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
      DO(SkipFieldValue());
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }